

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::message::~message(message *this)

{
  message *this_local;
  
  *(undefined ***)this = &PTR__message_001f79b0;
  comment::~comment(&this->note);
  location::~location(&this->where);
  std::__cxx11::string::~string((string *)&this->kind);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~message() throw() {}